

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

int copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  pointer pcVar1;
  long lVar2;
  int extraout_EAX;
  FILE *__stream;
  FILE *__stream_00;
  __ssize_t _Var3;
  FILE *unaff_RBX;
  size_t line_size;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_60;
  FILE *pFStack_48;
  EVP_PKEY_CTX *pEStack_40;
  char *local_30;
  size_t local_28;
  
  pEStack_40 = (EVP_PKEY_CTX *)0x1075f5;
  __stream = fopen((char *)dst,"r");
  if (__stream == (FILE *)0x0) {
    pEStack_40 = (EVP_PKEY_CTX *)0x107678;
    copy();
  }
  else {
    pEStack_40 = (EVP_PKEY_CTX *)0x10760c;
    dst = src;
    __stream_00 = fopen((char *)src,"wa");
    unaff_RBX = __stream;
    if (__stream_00 != (FILE *)0x0) {
      local_28 = 0;
      local_30 = (char *)0x0;
      pEStack_40 = (EVP_PKEY_CTX *)0x10762e;
      _Var3 = getline(&local_30,&local_28,__stream);
      if (0 < _Var3) {
        do {
          pEStack_40 = (EVP_PKEY_CTX *)0x10764a;
          fputs(local_30,__stream_00);
          pEStack_40 = (EVP_PKEY_CTX *)0x107658;
          _Var3 = getline(&local_30,&local_28,__stream);
        } while (0 < _Var3);
      }
      pEStack_40 = (EVP_PKEY_CTX *)0x107667;
      free(local_30);
      return extraout_EAX;
    }
  }
  pEStack_40 = (EVP_PKEY_CTX *)last_commit_hash_abi_cxx11_;
  copy();
  pFStack_48 = unaff_RBX;
  pEStack_40 = src;
  read_all_lines_abi_cxx11_(&vStack_60,HEAD_abi_cxx11_._M_dataplus._M_p);
  if (vStack_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      vStack_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    *(string **)dst = (string *)dst + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)dst,"");
  }
  else {
    *(string **)dst = (string *)dst + 0x10;
    pcVar1 = vStack_60.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)dst,pcVar1,
               pcVar1 + vStack_60.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length);
    lVar2 = *(long *)((string *)dst + 8);
    if ((lVar2 != 0) && (*(char *)(*(long *)dst + -1 + lVar2) == '\n')) {
      *(long *)((string *)dst + 8) = lVar2 + -1;
      *(undefined1 *)(*(long *)dst + lVar2 + -1) = 0;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_60);
  return (int)dst;
}

Assistant:

void copy(const char *source, const char *dest) {
    FILE* file1 = fopen(source, "r");
    if(file1 == NULL){
        perror("file1");
        exit(EXIT_FAILURE);
    }
    FILE* file2 = fopen(dest, "wa");
    if(file2 == NULL){
        perror("file2");
        exit(EXIT_FAILURE);
    }
    size_t line_size=0;
    char* line_buf=0;
    while (getline(&line_buf, &line_size, file1) > 0) {
        fprintf(file2,"%s",line_buf);
    }
    free(line_buf);
    line_buf=NULL;
}